

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int lhMapWriteRecord(lhash_kv_engine *pEngine,pgno iLogic,pgno iReal)

{
  sxu16 *psVar1;
  ulong uVar2;
  uchar *puVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  sxu32 sVar8;
  unqlite_page *pPage;
  unqlite_page *pOld;
  unqlite_page *local_28;
  unqlite_page *local_20;
  uchar *puVar9;
  
  local_28 = (unqlite_page *)0x0;
  if ((int)(uint)(pEngine->sPageMap).iPtr <= pEngine->iPageSize + -0x10) goto LAB_00113a4c;
  uVar5 = (*pEngine->pIo->xGet)(pEngine->pIo->pHandle,(pEngine->sPageMap).iNum,&local_20);
  puVar9 = (uchar *)(ulong)uVar5;
  if (uVar5 == 0) {
    uVar5 = lhAcquirePage(pEngine,&local_28);
    puVar9 = (uchar *)(ulong)uVar5;
    if (uVar5 != 0) goto LAB_00113a42;
    (pEngine->sPageMap).iNext = 0;
    (pEngine->sPageMap).iNum = local_28->iPage;
    (pEngine->sPageMap).nRec = 0;
    (pEngine->sPageMap).iPtr = 0xc;
    uVar5 = (*pEngine->pIo->xWrite)(local_20);
    puVar9 = (uchar *)(ulong)uVar5;
    if (uVar5 != 0) goto LAB_00113a42;
    if (local_20->iPage == pEngine->pHeader->iPage) {
      uVar2 = local_28->iPage;
      *(ulong *)((long)local_20->zData + 0x20) =
           uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
           (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
           (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
    }
    else {
      uVar2 = local_28->iPage;
      *(ulong *)local_20->zData =
           uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
           (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
           (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
      (*pEngine->pIo->xPageUnref)(local_20);
    }
    uVar5 = (*pEngine->pIo->xWrite)(local_28);
    puVar9 = (uchar *)(ulong)uVar5;
    if (uVar5 != 0) goto LAB_00113a42;
    puVar9 = local_28->zData;
    puVar9[0] = '\0';
    puVar9[1] = '\0';
    puVar9[2] = '\0';
    puVar9[3] = '\0';
    puVar9[4] = '\0';
    puVar9[5] = '\0';
    puVar9[6] = '\0';
    puVar9[7] = '\0';
    bVar4 = true;
  }
  else {
LAB_00113a42:
    bVar4 = false;
  }
  if (!bVar4) {
    return (int)puVar9;
  }
LAB_00113a4c:
  if (((local_28 != (unqlite_page *)0x0) ||
      (iVar6 = (*pEngine->pIo->xGet)(pEngine->pIo->pHandle,(pEngine->sPageMap).iNum,&local_28),
      iVar6 == 0)) && (iVar6 = (*pEngine->pIo->xWrite)(local_28), iVar6 == 0)) {
    *(pgno *)(local_28->zData + (pEngine->sPageMap).iPtr) =
         iLogic >> 0x38 | (iLogic & 0xff000000000000) >> 0x28 | (iLogic & 0xff0000000000) >> 0x18 |
         (iLogic & 0xff00000000) >> 8 | (iLogic & 0xff000000) << 8 | (iLogic & 0xff0000) << 0x18 |
         (iLogic & 0xff00) << 0x28 | iLogic << 0x38;
    uVar5 = *(int *)&(pEngine->sPageMap).iPtr + 8;
    (pEngine->sPageMap).iPtr = (sxu16)uVar5;
    *(pgno *)(local_28->zData + (uVar5 & 0xffff)) =
         iReal >> 0x38 | (iReal & 0xff000000000000) >> 0x28 | (iReal & 0xff0000000000) >> 0x18 |
         (iReal & 0xff00000000) >> 8 | (iReal & 0xff000000) << 8 | (iReal & 0xff0000) << 0x18 |
         (iReal & 0xff00) << 0x28 | iReal << 0x38;
    psVar1 = &(pEngine->sPageMap).iPtr;
    *psVar1 = *psVar1 + 8;
    iVar7 = lhMapInstallBucket(pEngine,iLogic,iReal);
    iVar6 = -1;
    if (iVar7 == 0) {
      sVar8 = (pEngine->sPageMap).nRec + 1;
      (pEngine->sPageMap).nRec = sVar8;
      if (local_28->iPage == pEngine->pHeader->iPage) {
        puVar3 = local_28->zData;
        puVar9 = puVar3 + 0x28;
        *(ushort *)(puVar3 + 0x2a) = (ushort)sVar8 << 8 | (ushort)sVar8 >> 8;
        puVar3[0x29] = (uchar)(sVar8 >> 0x10);
      }
      else {
        iVar6 = (*pEngine->pIo->xWrite)(local_28);
        if (iVar6 != 0) {
          return iVar6;
        }
        puVar3 = local_28->zData;
        puVar9 = puVar3 + 8;
        sVar8 = (pEngine->sPageMap).nRec;
        *(ushort *)(puVar3 + 10) = (ushort)sVar8 << 8 | (ushort)sVar8 >> 8;
        puVar3[9] = (uchar)(sVar8 >> 0x10);
      }
      *puVar9 = (uchar)(sVar8 >> 0x18);
      iVar6 = 0;
    }
  }
  return iVar6;
}

Assistant:

static int lhMapWriteRecord(lhash_kv_engine *pEngine,pgno iLogic,pgno iReal)
{
	lhash_bmap_page *pMap = &pEngine->sPageMap;
	unqlite_page *pPage = 0;
	int rc;
	if( pMap->iPtr > (pEngine->iPageSize - 16) /* 8 byte logical bucket number + 8 byte real bucket number */ ){
		unqlite_page *pOld;
		/* Point to the old page */
		rc = pEngine->pIo->xGet(pEngine->pIo->pHandle,pMap->iNum,&pOld);
		if( rc != UNQLITE_OK ){
			return rc;
		}
		/* Acquire a new page */
		rc = lhAcquirePage(pEngine,&pPage);
		if( rc != UNQLITE_OK ){
			return rc;
		}
		/* Reflect the change  */
		pMap->iNext = 0;
		pMap->iNum = pPage->iPage;
		pMap->nRec = 0;
		pMap->iPtr = 8/* Next page number */+4/* Total records in the map*/;
		/* Link this page */
		rc = pEngine->pIo->xWrite(pOld);
		if( rc != UNQLITE_OK ){
			return rc;
		}
		if( pOld->iPage == pEngine->pHeader->iPage ){
			/* First page (Hash header) */
			SyBigEndianPack64(&pOld->zData[4/*magic*/+4/*hash*/+8/* Free page */+8/*current split bucket*/+8/*Maximum split bucket*/],pPage->iPage);
		}else{
			/* Link the new page */
			SyBigEndianPack64(pOld->zData,pPage->iPage);
			/* Unref */
			pEngine->pIo->xPageUnref(pOld);
		}
		/* Assume the last bucket map page */
		rc = pEngine->pIo->xWrite(pPage);
		if( rc != UNQLITE_OK ){
			return rc;
		}
		SyBigEndianPack64(pPage->zData,0); /* Next bucket map page on the list */
	}
	if( pPage == 0){
		/* Point to the current map page */
		rc = pEngine->pIo->xGet(pEngine->pIo->pHandle,pMap->iNum,&pPage);
		if( rc != UNQLITE_OK ){
			return rc;
		}
	}
	/* Make page writable */
	rc = pEngine->pIo->xWrite(pPage);
	if( rc != UNQLITE_OK ){
		return rc;
	}
	/* Write the data */
	SyBigEndianPack64(&pPage->zData[pMap->iPtr],iLogic);
	pMap->iPtr += 8;
	SyBigEndianPack64(&pPage->zData[pMap->iPtr],iReal);
	pMap->iPtr += 8;
	/* Install the bucket map */
	rc = lhMapInstallBucket(pEngine,iLogic,iReal);
	if( rc == UNQLITE_OK ){
		/* Total number of records */
		pMap->nRec++;
		if( pPage->iPage == pEngine->pHeader->iPage ){
			/* Page one: Always writable */
			SyBigEndianPack32(
				&pPage->zData[4/*magic*/+4/*hash*/+8/* Free page */+8/*current split bucket*/+8/*Maximum split bucket*/+8/*Next map page*/],
				pMap->nRec);
		}else{
			/* Make page writable */
			rc = pEngine->pIo->xWrite(pPage);
			if( rc != UNQLITE_OK ){
				return rc;
			}
			SyBigEndianPack32(&pPage->zData[8],pMap->nRec);
		}
	}
	return rc;
}